

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::SetPreTransmissionDelay(RTPSession *this,RTPTime *delay)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if ((this->created == true) && (iVar1 = -0x32, (this->rtcpbuilder).init == true)) {
    (this->rtcpbuilder).transmissiondelay.m_t = delay->m_t;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetPreTransmissionDelay(const RTPTime &delay)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = rtcpbuilder.SetPreTransmissionDelay(delay);
	BUILDER_UNLOCK
	return status;
}